

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O3

QAMList * __thiscall
OSTEI_VRR_Algorithm_Base::GenerateAMReq
          (QAMList *__return_storage_ptr__,OSTEI_VRR_Algorithm_Base *this,QAM *am,RRStepType rrstep,
          bool all)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pcVar6;
  undefined8 uVar7;
  bool bVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined3 in_register_00000081;
  undefined4 uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  value_type *__x;
  QAMList req;
  QAM local_358;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 local_318 [16];
  pointer local_308;
  QAMList *local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e8;
  size_type local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  size_type local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  char local_48 [24];
  
  uVar10 = CONCAT31(in_register_00000081,all);
  local_318 = (undefined1  [16])0x0;
  local_308 = (pointer)0x0;
  local_300 = __return_storage_ptr__;
  switch(rrstep) {
  case I:
    iVar2 = (am->qam)._M_elems[0];
    iVar3 = (am->qam)._M_elems[3];
    local_328 = *(undefined8 *)((am->qam)._M_elems + 1);
    uStack_320 = 0;
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
    local_358.qam._M_elems[0] = iVar2 + -1;
    paVar11 = &local_358.tag.field_2;
    local_358.qam._M_elems[1] = (int)local_328;
    local_358.qam._M_elems[2] = (int)((ulong)local_328 >> 0x20);
    if (local_88 == &local_78) {
      local_358.tag.field_2._8_8_ = local_78._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_88;
    }
    local_358.tag._M_string_length = local_80;
    local_80 = 0;
    local_78._M_local_buf[0] = '\0';
    local_358.qam._M_elems[3] = iVar3;
    local_88 = &local_78;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar11) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    iVar2 = (am->qam)._M_elems[0];
    iVar3 = (am->qam)._M_elems[3];
    local_328 = *(undefined8 *)((am->qam)._M_elems + 1);
    uStack_320 = 0;
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
    local_358.qam._M_elems[0] = iVar2 + -2;
    local_358.qam._M_elems[1] = (int)local_328;
    local_358.qam._M_elems[2] = (int)((ulong)local_328 >> 0x20);
    if (local_a8 == &local_98) {
      local_358.tag.field_2._8_8_ = local_98._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_a8;
    }
    local_358.tag._M_string_length = local_a0;
    local_a0 = 0;
    local_98._M_local_buf[0] = '\0';
    local_358.qam._M_elems[3] = iVar3;
    local_a8 = &local_98;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar11) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    local_328 = *(undefined8 *)(am->qam)._M_elems;
    uStack_320 = 0;
    local_2f8 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_2f0 = 0;
    local_c8 = &local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
    local_358.qam._M_elems[0] = (int)local_328 + -1;
    local_358.qam._M_elems[1] = local_328._4_4_ + -1;
    local_358.qam._M_elems[2] = (int)local_2f8;
    local_358.qam._M_elems[3] = (int)((ulong)local_2f8 >> 0x20);
    if (local_c8 == &local_b8) {
      local_358.tag.field_2._8_8_ = local_b8._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_c8;
    }
    local_358.tag._M_string_length = local_c0;
    local_c0 = 0;
    local_b8._M_local_buf[0] = '\0';
    local_c8 = &local_b8;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar11) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    local_328 = CONCAT44(local_328._4_4_,uVar10);
    if (local_c8 != &local_b8) {
      operator_delete(local_c8);
    }
    iVar2 = (am->qam)._M_elems[0];
    iVar3 = (am->qam)._M_elems[1];
    iVar4 = (am->qam)._M_elems[2];
    iVar5 = (am->qam)._M_elems[3];
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
    local_358.qam._M_elems[2] = iVar4 + -1;
    local_358.qam._M_elems[0] = iVar2 + -1;
    paVar1 = &local_358.tag.field_2;
    if (local_e8 == &local_d8) {
      local_358.tag.field_2._8_8_ = local_d8._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_e8;
    }
    uVar10 = (int)local_328;
    local_358.tag._M_string_length = local_e0;
    local_e0 = 0;
    local_d8._M_local_buf[0] = '\0';
    local_358.qam._M_elems[1] = iVar3;
    local_358.qam._M_elems[3] = iVar5;
    local_e8 = &local_d8;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar1) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8);
    }
    iVar2 = (am->qam)._M_elems[0];
    iVar3 = (am->qam)._M_elems[3];
    local_328 = *(undefined8 *)((am->qam)._M_elems + 1);
    uStack_320 = 0;
    paVar11 = &local_f8;
    local_108 = paVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    local_358.qam._M_elems[3] = iVar3 + -1;
    local_358.qam._M_elems[0] = iVar2 + -1;
    local_358.qam._M_elems[1] = (int)local_328;
    local_358.qam._M_elems[2] = (int)((ulong)local_328 >> 0x20);
    if (local_108 == paVar11) {
      local_358.tag.field_2._8_8_ = local_f8._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_108;
    }
    local_358.tag._M_string_length = local_100;
    local_100 = 0;
    local_f8._M_local_buf[0] = '\0';
    local_108 = paVar11;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    paVar9 = local_108;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar1) {
      operator_delete(local_358.tag._M_dataplus._M_p);
      paVar9 = local_108;
    }
    break;
  case J:
    iVar2 = (am->qam)._M_elems[0];
    iVar3 = (am->qam)._M_elems[1];
    local_328 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_320 = 0;
    local_128 = &local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
    local_358.qam._M_elems[1] = iVar3 + -1;
    paVar11 = &local_358.tag.field_2;
    local_358.qam._M_elems[2] = (int)local_328;
    local_358.qam._M_elems[3] = (int)((ulong)local_328 >> 0x20);
    if (local_128 == &local_118) {
      local_358.tag.field_2._8_8_ = local_118._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_128;
    }
    local_358.tag._M_string_length = local_120;
    local_120 = 0;
    local_118._M_local_buf[0] = '\0';
    local_358.qam._M_elems[0] = iVar2;
    local_128 = &local_118;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar11) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    if (local_128 != &local_118) {
      operator_delete(local_128);
    }
    local_328 = *(undefined8 *)(am->qam)._M_elems;
    uStack_320 = 0;
    local_2f8 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_2f0 = 0;
    local_148 = &local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"");
    local_358.qam._M_elems[0] = (int)local_328 + -1;
    local_358.qam._M_elems[1] = local_328._4_4_ + -1;
    local_358.qam._M_elems[2] = (int)local_2f8;
    local_358.qam._M_elems[3] = (int)((ulong)local_2f8 >> 0x20);
    if (local_148 == &local_138) {
      local_358.tag.field_2._8_8_ = local_138._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_148;
    }
    local_358.tag._M_string_length = local_140;
    local_140 = 0;
    local_138._M_local_buf[0] = '\0';
    local_148 = &local_138;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar11) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    if (local_148 != &local_138) {
      operator_delete(local_148);
    }
    iVar2 = (am->qam)._M_elems[0];
    iVar3 = (am->qam)._M_elems[1];
    local_328 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_320 = 0;
    local_168 = &local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"");
    local_358.qam._M_elems[1] = iVar3 + -2;
    local_358.qam._M_elems[2] = (int)local_328;
    local_358.qam._M_elems[3] = (int)((ulong)local_328 >> 0x20);
    if (local_168 == &local_158) {
      local_358.tag.field_2._8_8_ = local_158._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_168;
    }
    local_358.tag._M_string_length = local_160;
    local_160 = 0;
    local_158._M_local_buf[0] = '\0';
    local_358.qam._M_elems[0] = iVar2;
    local_168 = &local_158;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar11) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    if (local_168 != &local_158) {
      operator_delete(local_168);
    }
    iVar2 = (am->qam)._M_elems[0];
    iVar3 = (am->qam)._M_elems[3];
    local_328 = *(undefined8 *)((am->qam)._M_elems + 1);
    uStack_320 = 0;
    local_188 = &local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"");
    local_358.qam._M_elems[1] = (int)local_328 + -1;
    local_358.qam._M_elems[2] = local_328._4_4_ + -1;
    local_358.tag._M_dataplus._M_p = (pointer)&local_358.tag.field_2;
    if (local_188 == &local_178) {
      local_358.tag.field_2._8_8_ = local_178._8_8_;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_188;
    }
    local_358.tag._M_string_length = local_180;
    local_180 = 0;
    local_178._M_local_buf[0] = '\0';
    local_358.qam._M_elems[0] = iVar2;
    local_358.qam._M_elems[3] = iVar3;
    local_188 = &local_178;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != &local_358.tag.field_2) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    if (local_188 != &local_178) {
      operator_delete(local_188);
    }
    iVar2 = (am->qam)._M_elems[0];
    iVar3 = (am->qam)._M_elems[1];
    iVar4 = (am->qam)._M_elems[2];
    iVar5 = (am->qam)._M_elems[3];
    local_1a8 = &local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
    local_358.qam._M_elems[3] = iVar5 + -1;
    local_358.qam._M_elems[1] = iVar3 + -1;
    paVar11 = &local_358.tag.field_2;
    if (local_1a8 == &local_198) {
      local_358.tag.field_2._8_8_ = local_198._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_1a8;
    }
    local_358.tag._M_string_length = local_1a0;
    local_1a0 = 0;
    local_198._M_local_buf[0] = '\0';
    local_358.qam._M_elems[0] = iVar2;
    local_358.qam._M_elems[2] = iVar4;
    local_1a8 = &local_198;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar11) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    paVar9 = local_1a8;
    if (local_1a8 == &local_198) goto switchD_0010a8b2_default;
    goto LAB_0010b9ac;
  case K:
    local_328 = *(undefined8 *)(am->qam)._M_elems;
    uStack_320 = 0;
    iVar2 = (am->qam)._M_elems[2];
    iVar3 = (am->qam)._M_elems[3];
    local_1c8 = &local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
    local_358.qam._M_elems[2] = iVar2 + -1;
    paVar11 = &local_358.tag.field_2;
    local_358.qam._M_elems[0] = (int)local_328;
    local_358.qam._M_elems[1] = (int)((ulong)local_328 >> 0x20);
    if (local_1c8 == &local_1b8) {
      local_358.tag.field_2._8_8_ = local_1b8._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_1c8;
    }
    local_358.tag._M_string_length = local_1c0;
    local_1c0 = 0;
    local_1b8._M_local_buf[0] = '\0';
    local_358.qam._M_elems[3] = iVar3;
    local_1c8 = &local_1b8;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar11) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8);
    }
    local_328 = *(undefined8 *)(am->qam)._M_elems;
    uStack_320 = 0;
    iVar2 = (am->qam)._M_elems[2];
    iVar3 = (am->qam)._M_elems[3];
    local_1e8 = &local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"");
    local_358.qam._M_elems[2] = iVar2 + -2;
    local_358.qam._M_elems[0] = (int)local_328;
    local_358.qam._M_elems[1] = (int)((ulong)local_328 >> 0x20);
    if (local_1e8 == &local_1d8) {
      local_358.tag.field_2._8_8_ = local_1d8._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_1e8;
    }
    local_358.tag._M_string_length = local_1e0;
    local_1e0 = 0;
    local_1d8._M_local_buf[0] = '\0';
    local_358.qam._M_elems[3] = iVar3;
    local_1e8 = &local_1d8;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar11) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8);
    }
    local_328 = *(undefined8 *)(am->qam)._M_elems;
    uStack_320 = 0;
    local_2f8 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_2f0 = 0;
    local_208 = &local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"");
    local_358.qam._M_elems[2] = (int)local_2f8 + -1;
    local_358.qam._M_elems[3] = local_2f8._4_4_ + -1;
    local_358.qam._M_elems[0] = (int)local_328;
    local_358.qam._M_elems[1] = (int)((ulong)local_328 >> 0x20);
    if (local_208 == &local_1f8) {
      local_358.tag.field_2._8_8_ = local_1f8._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_208;
    }
    local_358.tag._M_string_length = local_200;
    local_200 = 0;
    local_1f8._M_local_buf[0] = '\0';
    local_208 = &local_1f8;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar11) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    local_328 = CONCAT44(local_328._4_4_,uVar10);
    if (local_208 != &local_1f8) {
      operator_delete(local_208);
    }
    iVar2 = (am->qam)._M_elems[0];
    iVar3 = (am->qam)._M_elems[1];
    iVar4 = (am->qam)._M_elems[2];
    iVar5 = (am->qam)._M_elems[3];
    local_228 = &local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"");
    local_358.qam._M_elems[2] = iVar4 + -1;
    local_358.qam._M_elems[0] = iVar2 + -1;
    paVar1 = &local_358.tag.field_2;
    if (local_228 == &local_218) {
      local_358.tag.field_2._8_8_ = local_218._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_228;
    }
    uVar10 = (int)local_328;
    local_358.tag._M_string_length = local_220;
    local_220 = 0;
    local_218._M_local_buf[0] = '\0';
    local_358.qam._M_elems[1] = iVar3;
    local_358.qam._M_elems[3] = iVar5;
    local_228 = &local_218;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar1) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228);
    }
    iVar2 = (am->qam)._M_elems[0];
    iVar3 = (am->qam)._M_elems[3];
    local_328 = *(undefined8 *)((am->qam)._M_elems + 1);
    uStack_320 = 0;
    paVar11 = &local_238;
    local_248 = paVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
    local_358.qam._M_elems[1] = (int)local_328 + -1;
    local_358.qam._M_elems[2] = local_328._4_4_ + -1;
    if (local_248 == paVar11) {
      local_358.tag.field_2._8_8_ = local_238._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_248;
    }
    local_358.tag._M_string_length = local_240;
    local_240 = 0;
    local_238._M_local_buf[0] = '\0';
    local_358.qam._M_elems[0] = iVar2;
    local_358.qam._M_elems[3] = iVar3;
    local_248 = paVar11;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    paVar9 = local_248;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar1) {
      operator_delete(local_358.tag._M_dataplus._M_p);
      paVar9 = local_248;
    }
    break;
  case L:
    local_328 = *(undefined8 *)(am->qam)._M_elems;
    uStack_320 = 0;
    iVar2 = (am->qam)._M_elems[2];
    iVar3 = (am->qam)._M_elems[3];
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
    local_358.qam._M_elems[3] = iVar3 + -1;
    paVar11 = &local_358.tag.field_2;
    local_358.qam._M_elems[0] = (int)local_328;
    local_358.qam._M_elems[1] = (int)((ulong)local_328 >> 0x20);
    if (local_268 == &local_258) {
      local_358.tag.field_2._8_8_ = local_258._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_268;
    }
    local_358.tag._M_string_length = local_260;
    local_260 = 0;
    local_258._M_local_buf[0] = '\0';
    local_358.qam._M_elems[2] = iVar2;
    local_268 = &local_258;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar11) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268);
    }
    local_328 = *(undefined8 *)(am->qam)._M_elems;
    uStack_320 = 0;
    local_2f8 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_2f0 = 0;
    local_288 = &local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"");
    local_358.qam._M_elems[2] = (int)local_2f8 + -1;
    local_358.qam._M_elems[3] = local_2f8._4_4_ + -1;
    local_358.qam._M_elems[0] = (int)local_328;
    local_358.qam._M_elems[1] = (int)((ulong)local_328 >> 0x20);
    if (local_288 == &local_278) {
      local_358.tag.field_2._8_8_ = local_278._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_288;
    }
    local_358.tag._M_string_length = local_280;
    local_280 = 0;
    local_278._M_local_buf[0] = '\0';
    local_288 = &local_278;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar11) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288);
    }
    local_328 = *(undefined8 *)(am->qam)._M_elems;
    uStack_320 = 0;
    iVar2 = (am->qam)._M_elems[2];
    iVar3 = (am->qam)._M_elems[3];
    local_2a8 = &local_298;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
    local_358.qam._M_elems[3] = iVar3 + -2;
    local_358.qam._M_elems[0] = (int)local_328;
    local_358.qam._M_elems[1] = (int)((ulong)local_328 >> 0x20);
    if (local_2a8 == &local_298) {
      local_358.tag.field_2._8_8_ = local_298._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_2a8;
    }
    local_358.tag._M_string_length = local_2a0;
    local_2a0 = 0;
    local_298._M_local_buf[0] = '\0';
    local_358.qam._M_elems[2] = iVar2;
    local_2a8 = &local_298;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar11) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8);
    }
    iVar2 = (am->qam)._M_elems[0];
    iVar3 = (am->qam)._M_elems[3];
    local_328 = *(undefined8 *)((am->qam)._M_elems + 1);
    uStack_320 = 0;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"");
    local_358.qam._M_elems[3] = iVar3 + -1;
    local_358.qam._M_elems[0] = iVar2 + -1;
    local_358.qam._M_elems[1] = (int)local_328;
    local_358.qam._M_elems[2] = (int)((ulong)local_328 >> 0x20);
    if (local_2c8 == &local_2b8) {
      local_358.tag.field_2._8_8_ = local_2b8._8_8_;
      local_358.tag._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_2c8;
    }
    local_358.tag._M_string_length = local_2c0;
    local_2c0 = 0;
    local_2b8._M_local_buf[0] = '\0';
    local_2c8 = &local_2b8;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != paVar11) {
      operator_delete(local_358.tag._M_dataplus._M_p);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8);
    }
    iVar2 = (am->qam)._M_elems[0];
    iVar3 = (am->qam)._M_elems[1];
    iVar4 = (am->qam)._M_elems[2];
    iVar5 = (am->qam)._M_elems[3];
    paVar11 = &local_2d8;
    local_2e8 = paVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"");
    local_358.qam._M_elems[3] = iVar5 + -1;
    local_358.qam._M_elems[1] = iVar3 + -1;
    local_358.tag._M_dataplus._M_p = (pointer)&local_358.tag.field_2;
    if (local_2e8 == paVar11) {
      local_358.tag.field_2._8_8_ = local_2d8._8_8_;
    }
    else {
      local_358.tag._M_dataplus._M_p = (pointer)local_2e8;
    }
    local_358.tag._M_string_length = local_2e0;
    local_2e0 = 0;
    local_2d8._M_local_buf[0] = '\0';
    local_358.qam._M_elems[0] = iVar2;
    local_358.qam._M_elems[2] = iVar4;
    local_2e8 = paVar11;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,&local_358);
    paVar9 = local_2e8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.tag._M_dataplus._M_p != &local_358.tag.field_2) {
      operator_delete(local_358.tag._M_dataplus._M_p);
      paVar9 = local_2e8;
    }
    break;
  default:
    goto switchD_0010a8b2_default;
  }
  if (paVar9 != paVar11) {
LAB_0010b9ac:
    operator_delete(paVar9);
  }
switchD_0010a8b2_default:
  uVar7 = local_318._8_8_;
  if ((char)uVar10 == '\0') {
    (local_300->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (local_300->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (local_300->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (local_318._0_8_ != local_318._8_8_) {
      __x = (value_type *)local_318._0_8_;
      do {
        local_68._0_8_ = *(undefined8 *)(__x->qam)._M_elems;
        local_68._8_8_ = *(undefined8 *)((__x->qam)._M_elems + 2);
        pcVar6 = (__x->tag)._M_dataplus._M_p;
        local_58._M_p = local_48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar6,pcVar6 + (__x->tag)._M_string_length);
        bVar8 = ValidQAM((QAM *)local_68);
        if (local_58._M_p != local_48) {
          operator_delete(local_58._M_p);
        }
        if (bVar8) {
          std::vector<QAM,_std::allocator<QAM>_>::push_back(local_300,__x);
        }
        __x = __x + 1;
      } while (__x != (value_type *)uVar7);
    }
  }
  else {
    (local_300->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_318._0_8_;
    (local_300->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_318._8_8_;
    (local_300->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_308;
    local_318 = (undefined1  [16])0x0;
    local_308 = (pointer)0x0;
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector((vector<QAM,_std::allocator<QAM>_> *)local_318);
  return local_300;
}

Assistant:

QAMList OSTEI_VRR_Algorithm_Base::GenerateAMReq(QAM am, RRStepType rrstep, bool all) const
{
    QAMList req;
    switch(rrstep)
    {
        case RRStepType::I:
            req.push_back({am[0]-1, am[1]  , am[2]  , am[3]  });
            req.push_back({am[0]-2, am[1]  , am[2]  , am[3]  });
            req.push_back({am[0]-1, am[1]-1, am[2]  , am[3]  });
            req.push_back({am[0]-1, am[1]  , am[2]-1, am[3]  });
            req.push_back({am[0]-1, am[1]  , am[2]  , am[3]-1});
            break;
        case RRStepType::J:
            req.push_back({am[0]  , am[1]-1, am[2]  , am[3]  });
            req.push_back({am[0]-1, am[1]-1, am[2]  , am[3]  });
            req.push_back({am[0]  , am[1]-2, am[2]  , am[3]  });
            req.push_back({am[0]  , am[1]-1, am[2]-1, am[3]  });
            req.push_back({am[0]  , am[1]-1, am[2]  , am[3]-1});
            break;
        case RRStepType::K:
            req.push_back({am[0]  , am[1]  , am[2]-1, am[3]  });
            req.push_back({am[0]  , am[1]  , am[2]-2, am[3]  });
            req.push_back({am[0]  , am[1]  , am[2]-1, am[3]-1});
            req.push_back({am[0]-1, am[1]  , am[2]-1, am[3]  });
            req.push_back({am[0]  , am[1]-1, am[2]-1, am[3]  });
            break;
        case RRStepType::L:
            req.push_back({am[0]  , am[1]  , am[2]  , am[3]-1});
            req.push_back({am[0]  , am[1]  , am[2]-1, am[3]-1});
            req.push_back({am[0]  , am[1]  , am[2]  , am[3]-2});
            req.push_back({am[0]-1, am[1]  , am[2]  , am[3]-1});
            req.push_back({am[0]  , am[1]-1, am[2]  , am[3]-1});
            break;
    }

    // remove invalid quartets
    if(!all)
    {
        QAMList req2;
        for(const auto & it : req)
        {
            if(ValidQAM(it))
                req2.push_back(it);
        }
        return req2;
    }
    else
        return req;
}